

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

qsizetype QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_*>,_const_QString_&>,_char>,_const_QString_&>_>
          ::size(type *p)

{
  qsizetype qVar1;
  
  qVar1 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_*>,_const_QString_&>,_char>_>
          ::size(&p->a);
  return qVar1 + (p->b->d).size;
}

Assistant:

static qsizetype size(const type &p)
    {
        return QConcatenableEx<A>::size(p.a) + QConcatenableEx<B>::size(p.b);
    }